

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O1

void __thiscall BinarySearchTree::find(BinarySearchTree *this,int value,Node **par,Node **loc)

{
  int iVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = this->root;
  if (pNVar3 == (Node *)0x0) {
    pNVar3 = (Node *)0x0;
  }
  else {
    iVar1 = pNVar3->value;
    if (iVar1 != value) {
      do {
        pNVar2 = pNVar3;
        pNVar3 = (&pNVar2->leftChild)[iVar1 <= value];
        if (pNVar3 == (Node *)0x0) {
          pNVar3 = (Node *)0x0;
          break;
        }
        iVar1 = pNVar3->value;
      } while (iVar1 != value);
      goto LAB_00105bd1;
    }
  }
  pNVar2 = (Node *)0x0;
LAB_00105bd1:
  *loc = pNVar3;
  *par = pNVar2;
  return;
}

Assistant:

void BinarySearchTree::find(int value, Node **par, Node **loc) {
    Node *ptr, *ptrSave;
    if (root == nullptr) {
        *loc = nullptr;
        *par = nullptr;
        return;
    }
    if (value == root->value) {
        *loc = root;
        *par = nullptr;
        return;
    }
    if (value < root->value) {
        ptr = root->leftChild;
    } else {
        ptr = root->rightChild;
    }
    ptrSave = root;
    while (ptr != nullptr) {
        if (value == ptr->value) {
            *loc = ptr;
            *par = ptrSave;
            return;
        }
        ptrSave = ptr;
        if (value < ptr->value) {
            ptr = ptr->leftChild;
        } else {
            ptr = ptr->rightChild;
        }
    }
    *loc = nullptr;
    *par = ptrSave;
}